

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O2

void SplittingStepCoefficients_Write(SplittingStepCoefficients coefficients,FILE *outfile)

{
  sunrealtype **ppsVar1;
  int i;
  long lVar2;
  ulong uVar3;
  int j;
  int k;
  long lVar4;
  
  if ((((coefficients != (SplittingStepCoefficients)0x0 && outfile != (FILE *)0x0) &&
       (coefficients->alpha != (sunrealtype *)0x0)) && (coefficients->beta != (sunrealtype ***)0x0))
     && ((ppsVar1 = *coefficients->beta, ppsVar1 != (sunrealtype **)0x0 &&
         (*ppsVar1 != (sunrealtype *)0x0)))) {
    fprintf((FILE *)outfile,"  sequential methods = %i\n",
            (ulong)(uint)coefficients->sequential_methods);
    fprintf((FILE *)outfile,"  stages = %i\n",(ulong)(uint)coefficients->stages);
    fprintf((FILE *)outfile,"  partitions = %i\n",(ulong)(uint)coefficients->partitions);
    fprintf((FILE *)outfile,"  order = %i\n",(ulong)(uint)coefficients->order);
    fwrite("  alpha = ",10,1,(FILE *)outfile);
    for (lVar2 = 0; lVar2 < coefficients->sequential_methods; lVar2 = lVar2 + 1) {
      fprintf((FILE *)outfile,"% .15e  ",coefficients->alpha[lVar2]);
    }
    fputc(10,(FILE *)outfile);
    for (uVar3 = 0; (long)uVar3 < (long)coefficients->sequential_methods; uVar3 = uVar3 + 1) {
      fprintf((FILE *)outfile,"  beta[%i] = \n",uVar3 & 0xffffffff);
      for (lVar2 = 0; lVar2 <= coefficients->stages; lVar2 = lVar2 + 1) {
        fwrite("      ",6,1,(FILE *)outfile);
        for (lVar4 = 0; lVar4 < coefficients->partitions; lVar4 = lVar4 + 1) {
          fprintf((FILE *)outfile,"% .15e  ",coefficients->beta[uVar3][lVar2][lVar4]);
        }
        fputc(10,(FILE *)outfile);
      }
      fputc(10,(FILE *)outfile);
    }
  }
  return;
}

Assistant:

void SplittingStepCoefficients_Write(const SplittingStepCoefficients coefficients,
                                     FILE* const outfile)
{
  // TODO(SBR): update when https://github.com/LLNL/sundials/pull/517 merged
  if (outfile == NULL || coefficients == NULL || coefficients->alpha == NULL ||
      coefficients->beta == NULL || coefficients->beta[0] == NULL ||
      coefficients->beta[0][0] == NULL)
  {
    return;
  }

  fprintf(outfile, "  sequential methods = %i\n",
          coefficients->sequential_methods);
  fprintf(outfile, "  stages = %i\n", coefficients->stages);
  fprintf(outfile, "  partitions = %i\n", coefficients->partitions);
  fprintf(outfile, "  order = %i\n", coefficients->order);
  fprintf(outfile, "  alpha = ");
  for (int i = 0; i < coefficients->sequential_methods; i++)
  {
    fprintf(outfile, SUN_FORMAT_E "  ", coefficients->alpha[i]);
  }
  fprintf(outfile, "\n");

  for (int i = 0; i < coefficients->sequential_methods; i++)
  {
    fprintf(outfile, "  beta[%i] = \n", i);
    for (int j = 0; j <= coefficients->stages; j++)
    {
      fprintf(outfile, "      ");
      for (int k = 0; k < coefficients->partitions; k++)
      {
        fprintf(outfile, SUN_FORMAT_E "  ", coefficients->beta[i][j][k]);
      }
      fprintf(outfile, "\n");
    }
    fprintf(outfile, "\n");
  }
}